

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O2

void __thiscall
BVSparse<Memory::JitArenaAllocator>::~BVSparse(BVSparse<Memory::JitArenaAllocator> *this)

{
  Type pJVar1;
  Type pBVar2;
  Type_conflict pBVar3;
  
  pJVar1 = this->alloc;
  pBVar3 = this->head;
  while (pBVar3 != (Type_conflict)0x0) {
    this->lastFoundIndex = (Type_conflict)0x0;
    pBVar2 = pBVar3->next;
    pBVar3->next = pJVar1->bvFreeList;
    pJVar1->bvFreeList = pBVar3;
    this->lastUsedNodePrevNextField = &this->head;
    pBVar3 = pBVar2;
  }
  return;
}

Assistant:

BVSparse<TAllocator>::~BVSparse()
{
    BVSparseNode * curNode = this->head;
    while (curNode != nullptr)
    {
        curNode = this->DeleteNode(curNode);
    }
}